

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::MergeUpdateLoop<unsigned_char>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  void *__dest_00;
  uint uVar1;
  uint uVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  row_t rVar8;
  void *__dest_01;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  data_t *pdVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  bool bVar23;
  uchar result_values [2048];
  sel_t result_ids [2048];
  data_t local_2838 [2048];
  uint local_2038 [2050];
  
  pSVar3 = update->sel;
  pdVar4 = update->data;
  lVar11 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar1 = base_info->max;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)uVar1 * 4);
  __dest_01 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  lVar12 = (ulong)update_info->max * 4;
  if (count == 0) {
    sVar15 = 0;
    uVar19 = 0;
  }
  else {
    pdVar5 = base_data->data;
    psVar6 = sel->sel_vector;
    uVar16 = (ulong)update_info->N;
    uVar20 = (ulong)base_info->N;
    uVar19 = 0;
    uVar9 = 0;
    sVar15 = 0;
    uVar10 = 0;
    do {
      uVar13 = uVar9;
      if (psVar6 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar6[uVar9];
      }
      uVar21 = ids[uVar13] - lVar11;
      bVar23 = uVar19 < uVar16;
      uVar13 = uVar10;
      if (bVar23) {
        uVar17 = (ulong)*(uint *)((long)&update_info[1].segment + uVar19 * 4);
        if (uVar17 < uVar21) {
          lVar18 = 0;
          do {
            local_2838[lVar18 + sVar15] =
                 *(data_t *)((long)&update_info[1].segment + lVar18 + uVar19 + lVar12);
            local_2038[sVar15 + lVar18] = (uint)uVar17;
            if ((1 - uVar16) + uVar19 + lVar18 == 0) {
              sVar15 = sVar15 + lVar18 + 1;
              uVar19 = uVar19 + 1 + lVar18;
              goto LAB_0062b58f;
            }
            uVar17 = (ulong)*(uint *)((long)&update_info[1].segment + lVar18 * 4 + uVar19 * 4 + 4);
            lVar18 = lVar18 + 1;
          } while (uVar17 < uVar21);
          uVar19 = uVar19 + lVar18;
          bVar23 = uVar19 < uVar16;
          sVar15 = sVar15 + lVar18;
        }
        if ((!bVar23) || (uVar21 != uVar17)) goto LAB_0062b58f;
        local_2838[sVar15] = *(data_t *)((long)__dest_01 + uVar19);
        local_2038[sVar15] = (uint)uVar17;
        uVar19 = uVar19 + 1;
      }
      else {
LAB_0062b58f:
        bVar23 = uVar10 < uVar20;
        if (bVar23) {
          uVar17 = (ulong)*(uint *)((long)&__dest->segment + uVar10 * 4);
          if (uVar17 < uVar21) {
            do {
              uVar13 = uVar20;
              if (uVar20 - 1 == uVar10) goto LAB_0062b5d9;
              uVar17 = (ulong)*(uint *)((long)&base_info[1].segment + uVar10 * 4 + 4);
              uVar10 = uVar10 + 1;
            } while (uVar17 < uVar21);
            bVar23 = uVar10 < uVar20;
          }
          uVar13 = uVar10;
          if ((!bVar23) || (uVar21 != uVar17)) goto LAB_0062b5d9;
          pdVar14 = (data_t *)((long)__dest_00 + uVar10);
        }
        else {
LAB_0062b5d9:
          pdVar14 = pdVar5 + uVar21;
        }
        local_2838[sVar15] = *pdVar14;
        local_2038[sVar15] = (uint)uVar21;
      }
      sVar15 = sVar15 + 1;
      uVar9 = uVar9 + 1;
      uVar10 = uVar13;
    } while (uVar9 != count);
  }
  uVar10 = (ulong)update_info->N;
  sVar22 = uVar10 - uVar19;
  if (uVar19 <= uVar10 && sVar22 != 0) {
    switchD_00b1422a::default
              (local_2838 + sVar15,(void *)((long)&update_info[1].segment + lVar12 + uVar19),sVar22)
    ;
    switchD_00b1422a::default
              (local_2038 + sVar15,(void *)((long)&update_info[1].segment + uVar19 * 4),sVar22 * 4);
    sVar15 = (sVar15 - uVar19) + uVar10;
  }
  update_info->N = (sel_t)sVar15;
  switchD_00b1422a::default(__dest_01,local_2838,sVar15);
  switchD_00b1422a::default(update_info + 1,local_2038,sVar15 << 2);
  uVar19 = (ulong)base_info->N;
  if (count == 0 || uVar19 == 0) {
    sVar15 = 0;
    uVar20 = 0;
    uVar10 = 0;
  }
  else {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar3->sel_vector;
    sVar15 = 0;
    uVar10 = 0;
    uVar20 = 0;
    do {
      uVar9 = uVar10;
      if (psVar6 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar6[uVar10];
      }
      uVar16 = ids[uVar9] - lVar11;
      uVar2 = *(uint *)((long)&__dest->segment + uVar20 * 4);
      if (uVar16 == uVar2) {
        if (psVar7 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar7[uVar9];
        }
        local_2838[sVar15] = pdVar4[uVar9];
        local_2038[sVar15] = (uint)uVar16;
        uVar10 = uVar10 + 1;
LAB_0062b759:
        uVar20 = uVar20 + 1;
      }
      else {
        if (uVar2 <= uVar16) {
          local_2838[sVar15] = *(data_t *)((long)__dest_00 + uVar20);
          local_2038[sVar15] = uVar2;
          goto LAB_0062b759;
        }
        if (psVar7 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar7[uVar9];
        }
        local_2838[sVar15] = pdVar4[uVar9];
        local_2038[sVar15] = (uint)uVar16;
        uVar10 = uVar10 + 1;
      }
      sVar15 = sVar15 + 1;
    } while ((uVar10 < count) && (uVar20 < uVar19));
  }
  if (uVar10 < count) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar3->sel_vector;
    do {
      uVar9 = uVar10;
      if (psVar6 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar6[uVar10];
      }
      uVar16 = uVar9;
      if (psVar7 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar7[uVar9];
      }
      rVar8 = ids[uVar9];
      local_2838[sVar15] = pdVar4[uVar16];
      local_2038[sVar15] = (int)rVar8 - (int)lVar11;
      sVar15 = sVar15 + 1;
      uVar10 = uVar10 + 1;
    } while (count != uVar10);
  }
  sVar22 = uVar19 - uVar20;
  if (uVar20 <= uVar19 && sVar22 != 0) {
    switchD_00b1422a::default
              (local_2838 + sVar15,(void *)((long)&base_info[1].segment + (ulong)uVar1 * 4 + uVar20)
               ,sVar22);
    switchD_00b1422a::default
              (local_2038 + sVar15,(void *)((long)&base_info[1].segment + uVar20 * 4),sVar22 * 4);
    sVar15 = sVar15 + sVar22;
  }
  base_info->N = (sel_t)sVar15;
  switchD_00b1422a::default(__dest_00,local_2838,sVar15);
  switchD_00b1422a::default(__dest,local_2038,sVar15 << 2);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}